

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PS2KeyboardAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
PS2KeyboardAnalyzerSettings::UpdateInterfacesFromSettings(PS2KeyboardAnalyzerSettings *this)

{
  element_type *peVar1;
  PS2KeyboardAnalyzerSettings *this_local;
  
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mClockChannelInterface)
  ;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  peVar1 = std::auto_ptr<AnalyzerSettingInterfaceChannel>::operator->(&this->mDataChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)peVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::operator->(&this->mDeviceTypeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber(this->mDeviceType);
  return;
}

Assistant:

void PS2KeyboardAnalyzerSettings::UpdateInterfacesFromSettings()
{
    mClockChannelInterface->SetChannel( mClockChannel );
    mDataChannelInterface->SetChannel( mDataChannel );
    mDeviceTypeInterface->SetNumber( mDeviceType );
}